

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O2

void __thiscall
GaussianEdgeCalculator::GaussianEdgeCalculator
          (GaussianEdgeCalculator *this,double significance_level,double insert_size_mean,
          double insert_size_stddev)

{
  double *pdVar1;
  size_t x;
  long lVar2;
  double dVar3;
  normal norm2;
  normal norm;
  double local_60;
  double local_58;
  double local_50;
  complemented2_type<boost::math::normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_double>
  local_48;
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_38;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__GaussianEdgeCalculator_001d6f28;
  this->significance_level = significance_level;
  this->insert_size_popmean = insert_size_mean;
  this->insert_size_popstddev = insert_size_stddev;
  local_58 = insert_size_stddev;
  local_50 = significance_level;
  pdVar1 = (double *)operator_new__(0x4b320);
  this->cached_survival_function = pdVar1;
  boost::math::
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::normal_distribution(&local_38,0.0,1.0);
  for (lVar2 = 0; lVar2 != 0x9664; lVar2 = lVar2 + 1) {
    local_60 = (double)lVar2 * 0.001;
    local_48.dist = &local_38;
    local_48.param = &local_60;
    dVar3 = boost::math::
            cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      (&local_48);
    this->cached_survival_function[lVar2] = dVar3;
  }
  boost::math::
  normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::normal_distribution
            ((normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)&local_48,0.0,local_58 * 1.4142135623730951);
  local_60 = local_50 * 0.5;
  dVar3 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((normal_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                      *)&local_48,&local_60);
  dVar3 = floor(-dVar3);
  this->allowable_insert_size_diff = (int)dVar3;
  return;
}

Assistant:

GaussianEdgeCalculator::GaussianEdgeCalculator(double significance_level, double insert_size_mean, double insert_size_stddev) {
	this->significance_level = significance_level;
	this->insert_size_popmean = insert_size_mean;
	this->insert_size_popstddev = insert_size_stddev;
	cached_survival_function = new double[SF_CACHE_SIZE];
	boost::math::normal norm;
	for (size_t x=0; x<SF_CACHE_SIZE; ++x) {
		cached_survival_function[x] = boost::math::cdf(boost::math::complement(norm,x*SF_CACHE_FACTOR));
	}
	boost::math::normal norm2(0,sqrt2*insert_size_stddev);
	this->allowable_insert_size_diff = (int)floor(-boost::math::quantile(norm2, significance_level/2.0));
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
}